

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::AtomicDeclarationTest<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (AtomicDeclarationTest<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  ulong uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  bool bVar3;
  GLint max_atomics;
  uint local_1c4;
  string valid_shader_source;
  string invalid_shader_source;
  long local_180;
  char max [16];
  string indent;
  vector<unsigned_long,_std::allocator<unsigned_long>_> dimensions;
  string indexing;
  string comment;
  string valid_definition;
  string loop_end;
  string invalid_definition;
  char it [16];
  string valid_iteration;
  string invalid_iteration;
  
  uVar1 = (ulong)tested_shader_type;
  iVar2 = (*((this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).context_id)->
            m_renderCtx->_vptr_RenderContext[3])();
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  indent._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  indent.field_2._M_local_buf[0] = '\0';
  indexing._M_dataplus._M_p = (pointer)&indexing.field_2;
  indexing._M_string_length = 0;
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indexing.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&invalid_definition,test_shader_compilation::uniform_atomic_uint,
             (allocator<char> *)&invalid_iteration);
  invalid_iteration._M_dataplus._M_p = (pointer)&invalid_iteration.field_2;
  invalid_iteration._M_string_length = 0;
  invalid_iteration.field_2._M_local_buf[0] = '\0';
  invalid_shader_source._M_dataplus._M_p = (pointer)&invalid_shader_source.field_2;
  invalid_shader_source._M_string_length = 0;
  loop_end._M_dataplus._M_p = (pointer)&loop_end.field_2;
  loop_end._M_string_length = 0;
  max_atomics = 0;
  valid_shader_source._M_dataplus._M_p = (pointer)&valid_shader_source.field_2;
  valid_shader_source._M_string_length = 0;
  invalid_shader_source.field_2._M_local_buf[0] = '\0';
  loop_end.field_2._M_local_buf[0] = '\0';
  valid_shader_source.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&valid_definition,test_shader_compilation::uniform_atomic_uint,
             (allocator<char> *)&valid_iteration);
  valid_iteration._M_dataplus._M_p = (pointer)&valid_iteration.field_2;
  valid_iteration._M_string_length = 0;
  valid_iteration.field_2._M_local_buf[0] = '\0';
  if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1fcd);
LAB_00b9ccb6:
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))
            (*(undefined4 *)(&DAT_0171ccd0 + uVar1 * 4),&max_atomics);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x1fd3);
  if (max_atomics == 0) {
    std::__cxx11::string::~string((string *)&valid_iteration);
    std::__cxx11::string::~string((string *)&valid_definition);
    std::__cxx11::string::~string((string *)&valid_shader_source);
    std::__cxx11::string::~string((string *)&loop_end);
    std::__cxx11::string::~string((string *)&invalid_shader_source);
    std::__cxx11::string::~string((string *)&invalid_iteration);
    std::__cxx11::string::~string((string *)&invalid_definition);
    std::__cxx11::string::~string((string *)&indexing);
    std::__cxx11::string::~string((string *)&indent);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&dimensions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::__cxx11::string::~string((string *)&comment);
    return;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&dimensions,8);
  prepareDimensions<glcts::ArraysOfArrays::Interface::GL>((long)max_atomics,&dimensions);
  local_180 = 7;
  local_1c4 = 0;
  while (local_180 != -1) {
    std::__cxx11::string::append((char *)&indent);
    std::__cxx11::string::insert((ulong)&loop_end,(char *)0x0);
    std::__cxx11::string::insert((ulong)&loop_end,(string *)0x0);
    sprintf(it,"i%u",(ulong)local_1c4);
    std::__cxx11::string::append((char *)&indexing);
    std::__cxx11::string::append((char *)&indexing);
    std::__cxx11::string::append((char *)&indexing);
    sprintf(max,"%u",(ulong)(uint)dimensions.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start[local_180]);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::append((char *)&valid_definition);
    std::__cxx11::string::append((string *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    std::__cxx11::string::append((string *)&valid_iteration);
    std::__cxx11::string::append((char *)&valid_iteration);
    bVar3 = local_180 == 0;
    local_180 = local_180 + -1;
    if (bVar3) {
      sprintf(max,"%u",(ulong)((int)*dimensions.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    std::__cxx11::string::append((char *)&invalid_definition);
    std::__cxx11::string::append((char *)&invalid_definition);
    std::__cxx11::string::append((char *)&invalid_definition);
    std::__cxx11::string::append((string *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    std::__cxx11::string::append((string *)&invalid_iteration);
    std::__cxx11::string::append((char *)&invalid_iteration);
    local_1c4 = local_1c4 + 1;
  }
  sprintf(it,"%u",(ulong)(uint)max_atomics);
  std::__cxx11::string::append((char *)&comment);
  std::__cxx11::string::append((char *)&comment);
  std::__cxx11::string::append((char *)&comment);
  std::__cxx11::string::append((string *)&invalid_shader_source);
  std::__cxx11::string::append((string *)&invalid_shader_source);
  std::__cxx11::string::append((char *)&invalid_shader_source);
  std::__cxx11::string::append((string *)&invalid_shader_source);
  std::__cxx11::string::append((string *)&invalid_shader_source);
  std::__cxx11::string::append((char *)&invalid_shader_source);
  std::__cxx11::string::append((char *)&invalid_shader_source);
  std::__cxx11::string::append((string *)&invalid_shader_source);
  std::__cxx11::string::append((char *)&invalid_shader_source);
  std::__cxx11::string::append((string *)&invalid_shader_source);
  std::__cxx11::string::append((string *)&valid_shader_source);
  std::__cxx11::string::append((string *)&valid_shader_source);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::append((string *)&valid_shader_source);
  std::__cxx11::string::append((string *)&valid_shader_source);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::append((string *)&valid_shader_source);
  std::__cxx11::string::append((char *)&valid_shader_source);
  std::__cxx11::string::append((string *)&valid_shader_source);
  switch(uVar1) {
  case 0:
  case 2:
  case 5:
    goto switchD_00b9d177_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&invalid_shader_source);
    goto switchD_00b9d177_caseD_0;
  case 3:
    break;
  case 4:
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x203c);
    goto LAB_00b9ccb6;
  }
  std::__cxx11::string::append((string *)&invalid_shader_source);
switchD_00b9d177_caseD_0:
  std::__cxx11::string::append((string *)&invalid_shader_source);
  (*(code *)(&DAT_0171c954 + *(int *)(&DAT_0171c954 + uVar1 * 4)))();
  return;
}

Assistant:

void AtomicDeclarationTest<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const char* indent_step		   = "    ";
	static const char* uniform_atomic_uint = "layout(binding = 0) uniform atomic_uint";

	const glw::Functions& gl = this->context_id.getRenderContext().getFunctions();

	std::string			comment;
	std::vector<size_t> dimensions;
	std::string			indent;
	std::string			indexing;
	std::string			invalid_definition = uniform_atomic_uint;
	std::string			invalid_iteration;
	std::string			invalid_shader_source;
	std::string			loop_end;
	glw::GLint			max_atomics = 0;
	glw::GLenum			pname		= 0;
	std::string			valid_shader_source;
	std::string			valid_definition = uniform_atomic_uint;
	std::string			valid_iteration;

	/* Select pname of max for stage */
	switch (tested_shader_type)
	{
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		pname = GL_MAX_COMPUTE_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		pname = GL_MAX_FRAGMENT_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		pname = GL_MAX_GEOMETRY_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
		pname = GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		pname = GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS;
		break;
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		pname = GL_MAX_VERTEX_ATOMIC_COUNTERS;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Get maximum */
	gl.getIntegerv(pname, &max_atomics);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	if (0 == max_atomics)
	{
		/* Not supported - skip */
		return;
	}
	else
	{
		dimensions.resize(API::MAX_ARRAY_DIMENSIONS);
		prepareDimensions<API>(max_atomics, dimensions);
	}

	/* Prepare parts of shader */
	for (size_t i = API::MAX_ARRAY_DIMENSIONS; i != 0; --i)
	{
		char it[16];
		char max[16];

		indent += indent_step;

		loop_end.insert(0, "}\n");
		loop_end.insert(0, indent);

		sprintf(it, "i%u", (unsigned int)(API::MAX_ARRAY_DIMENSIONS - i));

		indexing += "[";
		indexing += it;
		indexing += "]";

		sprintf(max, "%u", (unsigned int)(dimensions[i - 1]));

		valid_definition += "[";
		valid_definition += max;
		valid_definition += "]";

		valid_iteration += indent;
		valid_iteration += "for (uint ";
		valid_iteration += it;
		valid_iteration += " = 0; ";
		valid_iteration += it;
		valid_iteration += " < ";
		valid_iteration += max;
		valid_iteration += "; ++";
		valid_iteration += it;
		valid_iteration += ")\n";
		valid_iteration += indent;
		valid_iteration += "{\n";

		if (1 == i)
		{
			sprintf(max, "%u", (unsigned int)(dimensions[i - 1] + 1));
		}
		invalid_definition += "[";
		invalid_definition += max;
		invalid_definition += "]";

		invalid_iteration += indent;
		invalid_iteration += "for (uint ";
		invalid_iteration += it;
		invalid_iteration += " = 0; ";
		invalid_iteration += it;
		invalid_iteration += " < ";
		invalid_iteration += max;
		invalid_iteration += "; ++";
		invalid_iteration += it;
		invalid_iteration += ")\n";
		invalid_iteration += indent;
		invalid_iteration += "{\n";
	}

	{
		char max[16];

		sprintf(max, "%u", (unsigned int)(max_atomics));
		comment += "/* MAX_*_ATOMIC_COUNTERS = ";
		comment += max;
		comment += " */\n";
	}

	/* Prepare invalid source */
	invalid_shader_source += comment;
	invalid_shader_source += invalid_definition;
	invalid_shader_source += " a;\n\nvoid main()\n{\n";
	invalid_shader_source += invalid_iteration;
	invalid_shader_source += indent;
	invalid_shader_source += indent_step;
	invalid_shader_source += "atomicCounterIncrement( a";
	invalid_shader_source += indexing;
	invalid_shader_source += " );\n";
	invalid_shader_source += loop_end;

	/* Prepare valid source */
	valid_shader_source += comment;
	valid_shader_source += valid_definition;
	valid_shader_source += " a;\n\nvoid main()\n{\n";
	valid_shader_source += valid_iteration;
	valid_shader_source += indent;
	valid_shader_source += indent_step;
	valid_shader_source += "atomicCounterIncrement( a";
	valid_shader_source += indexing;
	valid_shader_source += " );\n";
	valid_shader_source += loop_end;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, invalid_shader_source);
	DEFAULT_MAIN_ENDING(tested_shader_type, valid_shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, valid_shader_source, true, false);

	/* Expect build failure for invalid shader source */
	{
		bool negative_build_test_result = false;

		try
		{
			EXECUTE_POSITIVE_TEST(tested_shader_type, invalid_shader_source, true, false);
		}
		catch (...)
		{
			negative_build_test_result = true;
		}

		if (false == negative_build_test_result)
		{
			TCU_FAIL("It was expected that build process will fail");
		}
	}
}